

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_pubkey_tweak_mul(secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *tweak32)

{
  int iVar1;
  bool local_a9;
  int local_a8;
  uint local_a4;
  int overflow;
  int ret;
  secp256k1_scalar factor;
  secp256k1_ge p;
  uchar *tweak32_local;
  secp256k1_pubkey *pubkey_local;
  secp256k1_context *ctx_local;
  
  local_a4 = 0;
  local_a8 = 0;
  if (pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"pubkey != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (tweak32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"tweak32 != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    secp256k1_scalar_set_b32((secp256k1_scalar *)&overflow,tweak32,&local_a8);
    local_a9 = false;
    if (local_a8 == 0) {
      iVar1 = secp256k1_pubkey_load(ctx,(secp256k1_ge *)(factor.d + 3),pubkey);
      local_a9 = iVar1 != 0;
    }
    local_a4 = (uint)local_a9;
    memset(pubkey,0,0x40);
    if (local_a4 != 0) {
      iVar1 = secp256k1_eckey_pubkey_tweak_mul
                        ((secp256k1_ge *)(factor.d + 3),(secp256k1_scalar *)&overflow);
      if (iVar1 == 0) {
        local_a4 = 0;
      }
      else {
        secp256k1_pubkey_save(pubkey,(secp256k1_ge *)(factor.d + 3));
      }
    }
    ctx_local._4_4_ = local_a4;
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ec_pubkey_tweak_mul(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const unsigned char *tweak32) {
    secp256k1_ge p;
    secp256k1_scalar factor;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(tweak32 != NULL);

    secp256k1_scalar_set_b32(&factor, tweak32, &overflow);
    ret = !overflow && secp256k1_pubkey_load(ctx, &p, pubkey);
    memset(pubkey, 0, sizeof(*pubkey));
    if (ret) {
        if (secp256k1_eckey_pubkey_tweak_mul(&p, &factor)) {
            secp256k1_pubkey_save(pubkey, &p);
        } else {
            ret = 0;
        }
    }

    return ret;
}